

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

void __thiscall FTagManager::AddSectorTag(FTagManager *this,int sector,int tag)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  FTagItem *pFVar5;
  undefined1 local_2c [8];
  FTagItem it;
  uint i;
  int tag_local;
  int sector_local;
  FTagManager *this_local;
  
  if (tag != 0) {
    while (uVar2 = TArray<int,_int>::Size(&this->startForSector), uVar2 <= (uint)sector) {
      it.nexttag = -1;
      TArray<int,_int>::Push(&this->startForSector,&it.nexttag);
    }
    piVar3 = TArray<int,_int>::operator[](&this->startForSector,(long)sector);
    if (*piVar3 == -1) {
      uVar2 = TArray<FTagItem,_FTagItem>::Size(&this->allTags);
      puVar4 = (uint *)TArray<int,_int>::operator[](&this->startForSector,(long)sector);
      *puVar4 = uVar2;
    }
    else {
      piVar3 = TArray<int,_int>::operator[](&this->startForSector,(long)sector);
      for (it.tag = *piVar3; iVar1 = it.tag,
          uVar2 = TArray<FTagItem,_FTagItem>::Size(&this->allTags), (uint)iVar1 < uVar2;
          it.tag = it.tag + 1) {
        pFVar5 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(ulong)(uint)it.tag);
        if (pFVar5->tag == tag) {
          return;
        }
      }
    }
    it.target = -1;
    local_2c._0_4_ = sector;
    local_2c._4_4_ = tag;
    TArray<FTagItem,_FTagItem>::Push(&this->allTags,(FTagItem *)local_2c);
  }
  return;
}

Assistant:

void FTagManager::AddSectorTag(int sector, int tag)
{
	if (tag == 0) return;

	// This function assumes that all tags for a single sector get added sequentially.
	// Should there ever be some need for compatibility.txt to add tags to sectors which already have a tag this function needs to be changed to adjust the startForSector indices.
	while (startForSector.Size() <= (unsigned int)sector)
	{
		startForSector.Push(-1);
	}
	if (startForSector[sector] == -1)
	{
		startForSector[sector] = allTags.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForSector[sector]; i < allTags.Size(); i++)
		{
			if (allTags[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { sector, tag, -1 };
	allTags.Push(it);
}